

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

void __thiscall
Database::Database(Database *this,Engine type,string *host,unsigned_short port,string *user,
                  string *pass,string *db,bool connectnow)

{
  bool connectnow_local;
  string *pass_local;
  string *user_local;
  unsigned_short port_local;
  string *host_local;
  Engine type_local;
  Database *this_local;
  
  std::unique_ptr<Database::impl_,std::default_delete<Database::impl_>>::
  unique_ptr<std::default_delete<Database::impl_>,void>
            ((unique_ptr<Database::impl_,std::default_delete<Database::impl_>> *)this);
  std::__cxx11::string::string((string *)&this->host);
  std::__cxx11::string::string((string *)&this->user);
  std::__cxx11::string::string((string *)&this->pass);
  std::__cxx11::string::string((string *)&this->db);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->transaction_log);
  Database_Result::Database_Result(&this->callbackdata);
  this->connected = false;
  if (connectnow) {
    Connect(this,type,host,port,user,pass,db);
  }
  else {
    this->engine = type;
    std::__cxx11::string::operator=((string *)&this->host,(string *)host);
    std::__cxx11::string::operator=((string *)&this->user,(string *)user);
    std::__cxx11::string::operator=((string *)&this->pass,(string *)pass);
    this->port = (uint)port;
    std::__cxx11::string::operator=((string *)&this->db,(string *)db);
  }
  return;
}

Assistant:

Database::Database(Database::Engine type, const std::string& host, unsigned short port, const std::string& user, const std::string& pass, const std::string& db, bool connectnow)
{
	this->connected = false;

	if (connectnow)
	{
		this->Connect(type, host, port, user, pass, db);
	}
	else
	{
		this->engine = type;
		this->host = host;
		this->user = user;
		this->pass = pass;
		this->port = port;
		this->db = db;
	}
}